

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uraid.c
# Opt level: O0

LispPTR parse_atomstring(char *string)

{
  int iVar1;
  uint local_3c;
  DLword local_36;
  LispPTR aindex;
  DLword cnt;
  DLword namelen;
  char *pcStack_30;
  DLword packagelen;
  char *nameptr;
  char *packageptr;
  char *start;
  char *string_local;
  
  aindex._2_2_ = 0;
  local_36 = 0;
  for (start = string; *start != '\0'; start = start + 1) {
    if (*start == ':') {
      aindex._2_2_ = local_36;
      pcStack_30 = start + 1;
      local_36 = 0;
      *start = '\0';
      nameptr = string;
    }
    local_36 = local_36 + 1;
  }
  if (aindex._2_2_ != 0) {
    local_36 = local_36 - 1;
    iVar1 = strncmp(nameptr,"IL",(ulong)aindex._2_2_);
    string = pcStack_30;
    if (iVar1 != 0) {
      local_3c = get_package_atom(pcStack_30,local_36,nameptr,aindex._2_2_,0);
      goto LAB_00162232;
    }
  }
  local_3c = make_atom(string,0,local_36);
  if (local_3c == 0xffffffff) {
    printf("trying IL:\n");
    local_3c = get_package_atom(string,local_36,"INTERLISP",9,0);
  }
LAB_00162232:
  if (local_3c == 0xffffffff) {
    string_local._4_4_ = 0xffffffff;
  }
  else {
    printf("INDEX : %d\n",(ulong)(local_3c & 0xffff));
    string_local._4_4_ = local_3c & 0xffff;
  }
  return string_local._4_4_;
}

Assistant:

LispPTR parse_atomstring(char *string)
{
  char *start, *packageptr, *nameptr;
  DLword packagelen = 0;
  DLword namelen = 0;
  DLword cnt;
  LispPTR aindex;

  for (cnt = 0, start = string; *string != '\0'; string++, cnt++) {
    if (*string == ':') {
      packagelen = cnt;
      packageptr = start;
      nameptr = string + 1;
      cnt = 0;
      *string = 0;
    }
  }
  if (packagelen == 0) { /* treat as IL: */
    nameptr = start;
    namelen = cnt;
  } else
    namelen = cnt - 1;

  if ((packagelen == 0) || (strncmp(packageptr, "IL", packagelen) == 0)) { /* default IL: */
    aindex = make_atom(nameptr, 0, namelen);
    if (aindex == 0xffffffff) {
      printf("trying IL:\n");
      aindex = get_package_atom(nameptr, namelen, "INTERLISP", 9, 0);
    }
  } else
    aindex = get_package_atom(nameptr, namelen, packageptr, packagelen, 0);

  if (aindex == 0xffffffff) return (0xffffffff);
  printf("INDEX : %d\n", aindex & 0xffff);
  return (aindex & 0xffff);
}